

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonahanPlanner.cpp
# Opt level: O1

void __thiscall
MonahanPlanner::MonahanPlanner
          (MonahanPlanner *this,PlanningUnitDecPOMDPDiscrete *pu,bool doIncPrune)

{
  PlanningUnitDecPOMDPDiscrete *pPVar1;
  allocator_type local_29;
  value_type_conflict2 local_28;
  
  AlphaVectorPlanning::AlphaVectorPlanning(&this->super_AlphaVectorPlanning,pu);
  (this->super_AlphaVectorPlanning).super_TimedAlgorithm._vptr_TimedAlgorithm =
       (_func_int **)&PTR__MonahanPlanner_005a9b98;
  this->_m_doIncPrune = doIncPrune;
  (this->_m_qFunction).
  super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_qFunction).
  super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->_m_qFunction).
           super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->_m_qFunction).
           super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
  pPVar1 = (this->super_AlphaVectorPlanning)._m_pu;
  if (pPVar1 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar1 = (this->super_AlphaVectorPlanning)._m_puShared.px;
  }
  local_28 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->_m_maxNrAlphas,
             (pPVar1->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_horizon,&local_28,
             &local_29);
  (this->_m_resultsFilename)._M_dataplus._M_p = (pointer)&(this->_m_resultsFilename).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->_m_resultsFilename,"");
  return;
}

Assistant:

MonahanPlanner::MonahanPlanner(const PlanningUnitDecPOMDPDiscrete* pu,
                               bool doIncPrune) :
    AlphaVectorPlanning(pu),
    _m_doIncPrune(doIncPrune),
    _m_initialized(false),
    _m_alreadyComputed(false),
    _m_maxNrAlphas(GetPU()->GetHorizon(),0),
    _m_resultsFilename("")
{
}